

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# v_ft_math.cpp
# Opt level: O0

SW_FT_Long SW_FT_MulDiv(SW_FT_Long a,SW_FT_Long b,SW_FT_Long c)

{
  undefined8 local_38;
  undefined8 local_30;
  SW_FT_Long d;
  SW_FT_Int s;
  SW_FT_Long c_local;
  SW_FT_Long b_local;
  SW_FT_Long a_local;
  
  s = 1;
  a_local = a;
  if (a < 0) {
    a_local = -a;
    s = -1;
  }
  b_local = b;
  if (b < 0) {
    b_local = -b;
    s = -s;
  }
  c_local = c;
  if (c < 0) {
    c_local = -c;
    s = -s;
  }
  if (c_local < 1) {
    local_30 = 0x7fffffff;
  }
  else {
    local_30 = (a_local * b_local + (c_local >> 1)) / c_local;
  }
  if (s < 1) {
    local_38 = -local_30;
  }
  else {
    local_38 = local_30;
  }
  return local_38;
}

Assistant:

SW_FT_Long SW_FT_MulDiv(SW_FT_Long a, SW_FT_Long b, SW_FT_Long c)
{
    SW_FT_Int  s = 1;
    SW_FT_Long d;

    SW_FT_MOVE_SIGN(a, s);
    SW_FT_MOVE_SIGN(b, s);
    SW_FT_MOVE_SIGN(c, s);

    d = (SW_FT_Long)(c > 0 ? ((SW_FT_Int64)a * b + (c >> 1)) / c : 0x7FFFFFFFL);

    return (s > 0) ? d : -d;
}